

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

uint ncnn::get_elf_hwcap(uint type)

{
  uint uVar1;
  uint in_stack_00000010;
  
  uVar1 = get_elf_hwcap_from_proc_self_auxv(in_stack_00000010);
  return uVar1;
}

Assistant:

static unsigned int get_elf_hwcap(unsigned int type)
{
#if defined __ANDROID__
    unsigned int hwcap = get_elf_hwcap_from_getauxval(type);
    if (hwcap)
        return hwcap;
#endif

    return get_elf_hwcap_from_proc_self_auxv(type);
}